

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_chi2_test<trng::exponential_dist<long_double>>
               (exponential_dist<long_double> *d)

{
  undefined1 x [16];
  long lVar1;
  lcg64_shift *extraout_RDX;
  lcg64_shift *r;
  lcg64_shift *extraout_RDX_00;
  int i;
  int iVar2;
  AssertionHandler *this;
  int i_1;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar3;
  parameter_type P;
  undefined6 in_stack_fffffffffffffed2;
  vector<long_double,_std::allocator<long_double>_> quantil;
  vector<int,_std::allocator<int>_> count;
  StringRef local_e0;
  vector<double,_std::allocator<double>_> p;
  AssertionHandler catchAssertionHandler;
  lcg64_shift R;
  StringRef local_40;
  SourceLineInfo local_30;
  
  quantil.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  quantil.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  quantil.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  catchAssertionHandler.m_assertionInfo.macroName._0_10_ =
       (unkuint10)(uint6)catchAssertionHandler.m_assertionInfo.macroName._4_6_ << 0x20;
  this = (AssertionHandler *)0x80;
  std::vector<int,_std::allocator<int>_>::vector
            (&count,0x80,(value_type_conflict *)&catchAssertionHandler,(allocator_type *)&R);
  for (iVar2 = 1; iVar2 != 0x80; iVar2 = iVar2 + 1) {
    x._10_6_ = in_stack_fffffffffffffed2;
    x._0_10_ = (longdouble)iVar2 * (longdouble)0.0078125;
    in_ST7 = in_ST6;
    trng::exponential_dist<long_double>::icdf
              ((result_type_conflict3 *)d,(exponential_dist<long_double> *)this,
               (result_type_conflict3)x);
    this = &catchAssertionHandler;
    catchAssertionHandler.m_assertionInfo.macroName._0_10_ = in_ST0;
    std::vector<long_double,_std::allocator<long_double>_>::emplace_back<long_double>
              (&quantil,(longdouble *)&catchAssertionHandler);
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = in_ST7;
  }
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&R,P);
  r = extraout_RDX;
  for (iVar2 = 0; iVar2 != 10000; iVar2 = iVar2 + 1) {
    trng::exponential_dist<long_double>::operator()
              ((result_type_conflict3 *)d,(exponential_dist<long_double> *)&R,r);
    for (lVar1 = 0;
        (lVar1 != 0x1fc &&
        (in_ST7 = in_ST6,
        *(longdouble *)
         ((long)quantil.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar1 * 4) < in_ST0)); lVar1 = lVar1 + 4) {
    }
    *(int *)((long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar1) =
         *(int *)((long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar1) + 1;
    r = extraout_RDX_00;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = in_ST7;
  }
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x3f80000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&p,0x80,(value_type_conflict6 *)&catchAssertionHandler,(allocator_type *)&local_e0);
  dVar3 = chi_percentil(&p,&count);
  local_e0.m_start = "REQUIRE";
  local_e0.m_size = 7;
  local_30.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_30.line = 0xc2;
  Catch::StringRef::StringRef(&local_40,"(0.01 < c2_p and c2_p < 0.99)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_e0,&local_30,local_40,Normal);
  local_e0.m_start =
       (char *)(CONCAT71(local_e0.m_start._1_7_,-(dVar3 < 0.99) & -(0.01 < dVar3)) &
               0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_e0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&p.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&count.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
            (&quantil.super__Vector_base<long_double,_std::allocator<long_double>_>);
  return;
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}